

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O1

void png_benign_error(png_const_structrp png_ptr,png_const_charp error_message)

{
  short sVar1;
  
  sVar1 = (short)png_ptr->mode;
  if ((png_ptr->flags & 0x100000) == 0) {
    if ((sVar1 < 0) && (png_ptr->chunk_name != 0)) {
      png_chunk_error(png_ptr,error_message);
    }
    png_error(png_ptr,error_message);
  }
  if ((sVar1 < 0) && (png_ptr->chunk_name != 0)) {
    png_chunk_warning(png_ptr,error_message);
    return;
  }
  png_warning(png_ptr,error_message);
  return;
}

Assistant:

void PNGAPI
png_benign_error(png_const_structrp png_ptr, png_const_charp error_message)
{
   if ((png_ptr->flags & PNG_FLAG_BENIGN_ERRORS_WARN) != 0)
   {
#     ifdef PNG_READ_SUPPORTED
         if ((png_ptr->mode & PNG_IS_READ_STRUCT) != 0 &&
            png_ptr->chunk_name != 0)
            png_chunk_warning(png_ptr, error_message);
         else
#     endif
      png_warning(png_ptr, error_message);
   }

   else
   {
#     ifdef PNG_READ_SUPPORTED
         if ((png_ptr->mode & PNG_IS_READ_STRUCT) != 0 &&
            png_ptr->chunk_name != 0)
            png_chunk_error(png_ptr, error_message);
         else
#     endif
      png_error(png_ptr, error_message);
   }

#  ifndef PNG_ERROR_TEXT_SUPPORTED
      PNG_UNUSED(error_message)
#  endif
}